

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall
QTableWidget::scrollToItem(QTableWidget *this,QTableWidgetItem *item,ScrollHint hint)

{
  char *__s;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  QTableWidgetItem **local_28;
  
  local_28 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  if (item != (QTableWidgetItem *)0x0) {
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    __s = (char *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    QTableModel::index((QTableModel *)local_48,__s,(int)item);
    QTableView::scrollTo(&this->super_QTableView,(QModelIndex *)local_48,hint);
  }
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::scrollToItem(const QTableWidgetItem *item, QAbstractItemView::ScrollHint hint)
{
    Q_D(QTableWidget);
    if (!item)
        return;
    QModelIndex index = d->tableModel()->index(const_cast<QTableWidgetItem*>(item));
    Q_ASSERT(index.isValid());
    QTableView::scrollTo(index, hint);
}